

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O2

char * borg_restock_dynamic(int depth)

{
  int *piVar1;
  _Bool _Var2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (borg_formulas.restock.count <= lVar3) {
      return (char *)0x0;
    }
    piVar1 = (int *)borg_formulas.restock.items[lVar3];
    if (depth < *piVar1) break;
    _Var2 = check_condition(*(math_section **)(piVar1 + 4),depth);
    lVar3 = lVar3 + 1;
    if (_Var2) {
      return *(char **)(piVar1 + 2);
    }
  }
  return (char *)0x0;
}

Assistant:

const char *borg_restock_dynamic(int depth)
{
    int i;

    for (i = 0; i < borg_formulas.restock.count; i++) {
        struct borg_depth_line *d = borg_formulas.restock.items[i];
        if (d->dlevel > depth)
            break;
        if (check_condition(d->condition, depth))
            return d->reason;
    }

    return NULL;
}